

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReader.cpp
# Opt level: O0

Span<const_unsigned_char,_18446744073709551615UL> __thiscall
MILBlob::Blob::StorageReader::Impl::GetDataView<unsigned_char>(Impl *this,uint64_t offset)

{
  runtime_error *this_00;
  pointer this_01;
  Span<const_unsigned_char,_18446744073709551615UL> SVar1;
  Util *local_88;
  undefined1 local_68 [8];
  blob_metadata metadata;
  uint64_t offset_local;
  Impl *this_local;
  
  metadata.reserved_4 = offset;
  GetMetadata((blob_metadata *)local_68,this,offset);
  if (local_68._4_4_ != UInt8) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Metadata data type does not match requested type.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_01 = std::
            unique_ptr<const_MILBlob::Blob::MMapFileReader,_std::default_delete<const_MILBlob::Blob::MMapFileReader>_>
            ::operator->(&this->m_reader);
  SVar1 = MMapFileReader::ReadData(this_01,metadata.sizeInBytes,metadata._0_8_);
  local_88 = (Util *)SVar1.m_ptr;
  SVar1.m_ptr = (pointer)SVar1.m_size.m_size;
  SVar1 = Util::SpanCast<unsigned_char_const,unsigned_char_const>(local_88,SVar1);
  return SVar1;
}

Assistant:

Util::Span<const T> StorageReader::Impl::GetDataView(uint64_t offset) const
{
    auto metadata = GetMetadata(offset);

    MILVerifyIsTrue(metadata.mil_dtype == BlobDataTypeTraits<T>::DataType,
                    std::runtime_error,
                    "Metadata data type does not match requested type.");
    return Util::SpanCast<const T>(m_reader->ReadData(metadata.offset, metadata.sizeInBytes));
}